

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             *this,basic_string_view<char> value)

{
  ostream_type oVar1;
  uint uVar2;
  ostream_type *poVar3;
  align_spec *spec;
  char *pcVar4;
  void *in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *this_00;
  char *data;
  iterator iVar6;
  str_writer<char> local_30;
  
  this_00 = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             *)value.data_;
  poVar3 = this_00[1].out_._M_stream;
  if (poVar3 == (ostream_type *)0x0) {
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::write(this_00,(int)value.size_,in_RCX,(size_t)in_RCX);
    pcVar5 = extraout_RDX_00;
  }
  else {
    oVar1 = poVar3[0x11];
    if ((oVar1 != (ostream_type)0x0) && (oVar1 != (ostream_type)0x73)) {
      error_handler::on_error((error_handler *)&local_30,"invalid type specifier");
    }
    spec = (align_spec *)this_00[1].out_._M_stream;
    uVar2 = spec[1].width_;
    local_30.size_ = (size_t)(ulong)uVar2;
    if (in_RCX <= (void *)(ulong)uVar2) {
      local_30.size_ = (size_t)in_RCX;
    }
    if ((int)uVar2 < 0) {
      local_30.size_ = (size_t)in_RCX;
    }
    local_30.s = (char *)value.size_;
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                *)this_00,spec,&local_30);
    pcVar5 = extraout_RDX;
  }
  pcVar4 = (this_00->out_)._M_string;
  (this->writer_).out_._M_stream = (this_00->out_)._M_stream;
  (this->writer_).out_._M_string = pcVar4;
  iVar6._M_string = pcVar5;
  iVar6._M_stream = (ostream_type *)this;
  return iVar6;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }